

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c.c
# Opt level: O3

void atf_tc_expect_exit(int exitcode,char *msg,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  __va_list_tag *in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char local_e8 [8];
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  __va_list_tag *local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  microatf_context_validate_expect(_exitcode);
  microatf_context_static.expect = MICROATF_EXPECT_EXIT;
  local_e0 = &args[0].overflow_arg_area;
  local_e8[0] = '\x10';
  local_e8[1] = '\0';
  local_e8[2] = '\0';
  local_e8[3] = '\0';
  local_e8[4] = '0';
  local_e8[5] = '\0';
  local_e8[6] = '\0';
  local_e8[7] = '\0';
  local_d8 = local_c8;
  microatf_context_write_result_pack
            ((microatf_context_t *)"expected_exit",(char *)((ulong)_exitcode & 0xffffffff),(int)msg,
             local_e8,in_R8);
  return;
}

Assistant:

void
atf_tc_expect_exit(const int exitcode, const char *msg, ...)
{
	microatf_context_validate_expect(microatf_context);
	microatf_context->expect = MICROATF_EXPECT_EXIT;

	va_list args;
	va_start(args, msg);
	microatf_context_write_result_pack(microatf_context, /**/
	    "expected_exit", exitcode, msg, args);
	va_end(args);
}